

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BubbleJson.cpp
# Opt level: O0

ParseResults __thiscall
bubbleJson::BubbleJson::ParseLiteral
          (BubbleJson *this,BubbleValue *bubbleValue,char *expectJson,ValueTypes expectResult)

{
  int local_3c;
  int i;
  char *json;
  ValueTypes expectResult_local;
  char *expectJson_local;
  BubbleValue *bubbleValue_local;
  BubbleJson *this_local;
  
  Expect(this,*expectJson);
  local_3c = 0;
  while( true ) {
    if (expectJson[local_3c + 1] == '\0') {
      this->context->json = this->context->json + local_3c;
      bubbleValue->type = expectResult;
      return ParseResult_Ok;
    }
    if (this->context->json[local_3c] != expectJson[local_3c + 1]) break;
    local_3c = local_3c + 1;
  }
  return ParseResult_InvalidValue;
}

Assistant:

ParseResults BubbleJson::ParseLiteral(BubbleValue *bubbleValue, const char *expectJson, ValueTypes expectResult)
{
    Expect(expectJson[0]);

    const char *json = this->context->json;
    int i;
    //因为Expect里面json会自加1，所以json比expectJson快进一个字符
    for (i = 0; expectJson[i + 1]; i++)
    {
        if (json[i] != expectJson[i + 1])
            return ParseResult_InvalidValue;
    }
    this->context->json += i;
    bubbleValue->type = expectResult;
    return ParseResult_Ok;
}